

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ForkJoin.cpp
# Opt level: O3

void __thiscall
amrex::ForkJoin::modify_split
          (ForkJoin *this,string *name,int idx,
          Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
          *comp_split)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
  *this_00;
  pointer pCVar1;
  const_iterator cVar2;
  mapped_type *pmVar3;
  long lVar4;
  pointer piVar5;
  pointer piVar6;
  ulong uVar7;
  long lVar8;
  
  this_00 = &this->data;
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,name);
  lVar8 = (long)idx;
  if (cVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    pmVar3 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,name);
    lVar4 = ((long)(pmVar3->
                   super_vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>).
                   super__Vector_base<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pmVar3->
                   super_vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>).
                   super__Vector_base<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333;
    if (lVar4 - lVar8 != 0 && lVar8 <= lVar4) goto LAB_0052ef4d;
  }
  Assert_host("data.count(name) > 0 && data[name].size() > idx",
              "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Base/AMReX_ForkJoin.cpp"
              ,0x9e,"\"(name, index) pair doesn\'t exist\"");
LAB_0052ef4d:
  if (this->flag_invoked == true) {
    Assert_host("!flag_invoked",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Base/AMReX_ForkJoin.cpp"
                ,0xa0,"\"Can only specify custom split before first forkjoin() invocation\"");
  }
  piVar5 = (this->split_bounds).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  piVar6 = (this->split_bounds).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  uVar7 = (long)piVar6 - (long)piVar5;
  if ((long)(comp_split->
            super_vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
            ).
            super__Vector_base<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(comp_split->
            super_vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
            ).
            super__Vector_base<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3 !=
      (long)(uVar7 * 0x40000000 + -0x100000000) >> 0x20) {
    Assert_host("comp_split.size() == NTasks()",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Base/AMReX_ForkJoin.cpp"
                ,0xa2,"\"comp_split must be same length as number of tasks\"");
    piVar5 = (this->split_bounds).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    piVar6 = (this->split_bounds).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
    ;
    uVar7 = (long)piVar6 - (long)piVar5;
  }
  if (0 < (int)(uVar7 >> 2) + -1) {
    lVar4 = 0;
    do {
      pCVar1 = (comp_split->
               super_vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
               ).
               super__Vector_base<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pCVar1[lVar4].hi <= pCVar1[lVar4].lo) {
        Assert_host("comp_split[i].hi - comp_split[i].lo > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Base/AMReX_ForkJoin.cpp"
                    ,0xa5,"\"comp_split[i] must have positive number of components\"");
        piVar5 = (this->split_bounds).super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        piVar6 = (this->split_bounds).super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < ((long)piVar6 - (long)piVar5) * 0x40000000 + -0x100000000 >> 0x20);
  }
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,name);
  std::vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>::
  _M_move_assign(&(pmVar3->
                  super_vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>).
                  super__Vector_base<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar8].comp_split.
                  super_vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
                 ,comp_split);
  return;
}

Assistant:

void
ForkJoin::modify_split (const std::string &name, int idx, Vector<ComponentSet> comp_split)
{
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(data.count(name) > 0 && data[name].size() > idx,
                                     "(name, index) pair doesn't exist");
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(!flag_invoked,
                                     "Can only specify custom split before first forkjoin() invocation");
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(comp_split.size() == NTasks(),
                                     "comp_split must be same length as number of tasks");
    for (int i = 0; i < NTasks(); ++i) {
        AMREX_ALWAYS_ASSERT_WITH_MESSAGE(comp_split[i].hi - comp_split[i].lo > 0,
                                         "comp_split[i] must have positive number of components");
    }
    data[name][idx].comp_split = std::move(comp_split);
}